

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

void oaep_mask(ssh_hashalg *h,void *seed,int seedlen,void *vdata,int datalen)

{
  bool bVar1;
  ssh_hash *psVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  unsigned_long val;
  uchar hash [114];
  byte local_a8 [120];
  
  psVar2 = (*h->new)(h);
  if (psVar2 != (ssh_hash *)0x0) {
    (*psVar2->vt->reset)(psVar2);
  }
  if (0 < datalen) {
    val = 0;
    do {
      uVar6 = h->hlen & 0xffffffff;
      if ((ulong)(uint)datalen <= h->hlen) {
        uVar6 = (ulong)(uint)datalen;
      }
      (*psVar2->vt->reset)(psVar2);
      if (0x72 < h->hlen) {
        __assert_fail("h->hlen <= MAX_HASH_LEN",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c"
                      ,0x3ac,"void oaep_mask(const ssh_hashalg *, void *, int, void *, int)");
      }
      BinarySink_put_data(psVar2->binarysink_,seed,(long)seedlen);
      BinarySink_put_uint32(psVar2->binarysink_,val);
      (*psVar2->vt->digest)(psVar2,local_a8);
      iVar5 = (int)uVar6;
      if (0 < iVar5) {
        uVar3 = 0;
        do {
          *(byte *)((long)vdata + uVar3) = *(byte *)((long)vdata + uVar3) ^ local_a8[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
      val = (unsigned_long)((int)val + 1);
      vdata = (void *)((long)vdata + uVar6);
      uVar4 = datalen - iVar5;
      bVar1 = iVar5 <= datalen;
      datalen = uVar4;
    } while (uVar4 != 0 && bVar1);
  }
  (*psVar2->vt->free)(psVar2);
  return;
}

Assistant:

static void oaep_mask(const ssh_hashalg *h, void *seed, int seedlen,
                      void *vdata, int datalen)
{
    unsigned char *data = (unsigned char *)vdata;
    unsigned count = 0;

    ssh_hash *s = ssh_hash_new(h);

    while (datalen > 0) {
        int i, max = (datalen > h->hlen ? h->hlen : datalen);
        unsigned char hash[MAX_HASH_LEN];

        ssh_hash_reset(s);
        assert(h->hlen <= MAX_HASH_LEN);
        put_data(s, seed, seedlen);
        put_uint32(s, count);
        ssh_hash_digest(s, hash);
        count++;

        for (i = 0; i < max; i++)
            data[i] ^= hash[i];

        data += max;
        datalen -= max;
    }

    ssh_hash_free(s);
}